

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlStrsub(xmlChar *str,int start,int len)

{
  int local_24;
  int i;
  int len_local;
  int start_local;
  xmlChar *str_local;
  
  if (str == (xmlChar *)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else if (start < 0) {
    str_local = (xmlChar *)0x0;
  }
  else if (len < 0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    _len_local = str;
    for (local_24 = 0; local_24 < start; local_24 = local_24 + 1) {
      if (*_len_local == '\0') {
        return (xmlChar *)0x0;
      }
      _len_local = _len_local + 1;
    }
    if (*_len_local == '\0') {
      str_local = (xmlChar *)0x0;
    }
    else {
      str_local = xmlStrndup(_len_local,len);
    }
  }
  return str_local;
}

Assistant:

xmlChar *
xmlStrsub(const xmlChar *str, int start, int len) {
    int i;

    if (str == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    for (i = 0;i < start;i++) {
        if (*str == 0) return(NULL);
        str++;
    }
    if (*str == 0) return(NULL);
    return(xmlStrndup(str, len));
}